

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O3

parser_error visuals_parse_cycle(parser *parser)

{
  long lVar1;
  char *__s2;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  char *pcVar5;
  char *name;
  visuals_color_cycle *pvVar6;
  parser_error pVar7;
  long lVar8;
  ulong uVar9;
  long lVar11;
  long lVar10;
  
  pvVar3 = parser_priv(parser);
  pVar7 = PARSE_ERROR_INTERNAL;
  if (pvVar3 != (void *)0x0) {
    uVar4 = *(long *)((long)pvVar3 + 0x20) + 1;
    *(ulong *)((long)pvVar3 + 0x20) = uVar4;
    pVar7 = PARSE_ERROR_TOO_MANY_ENTRIES;
    if (uVar4 < *(ulong *)((long)pvVar3 + 0x18)) {
      pcVar5 = parser_getsym(parser,"group");
      pVar7 = PARSE_ERROR_INVALID_VALUE;
      if ((((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) &&
          (name = parser_getsym(parser,"name"), name != (char *)0x0)) && (*name != '\0')) {
        if (*(long *)(*(long *)((long)pvVar3 + 0x10) + *(long *)((long)pvVar3 + 0x20) * 8) == 0) {
          pvVar6 = visuals_color_cycle_new(name,0x20,0xff);
          lVar11 = *(long *)((long)pvVar3 + 0x20);
          *(visuals_color_cycle **)(*(long *)((long)pvVar3 + 0x10) + lVar11 * 8) = pvVar6;
          if (*(long *)(*(long *)((long)pvVar3 + 0x10) + lVar11 * 8) == 0) {
            return PARSE_ERROR_INTERNAL;
          }
        }
        lVar11 = *(long *)((long)pvVar3 + 0x38);
        if (lVar11 == 0) {
          lVar10 = 0;
        }
        else {
          lVar1 = *(long *)((long)pvVar3 + 0x30);
          lVar8 = 0;
          while (__s2 = *(char **)(lVar1 + lVar8 * 8), lVar10 = lVar8, __s2 != (char *)0x0) {
            iVar2 = strcmp(pcVar5,__s2);
            if ((iVar2 == 0) || (lVar8 = lVar8 + 1, lVar10 = lVar11, lVar11 == lVar8))
            goto LAB_001f2e84;
          }
          pcVar5 = string_make(pcVar5);
          *(char **)(*(long *)((long)pvVar3 + 0x30) + lVar8 * 8) = pcVar5;
        }
LAB_001f2e84:
        uVar9 = lVar10 << 6;
        uVar4 = *(ulong *)((long)pvVar3 + 0x48);
        lVar11 = 0x40;
        do {
          if (uVar9 < uVar4) {
            lVar10 = *(long *)((long)pvVar3 + 0x40);
            lVar1 = *(long *)(lVar10 + uVar9 * 8);
            if ((lVar1 == 0) ||
               ((pcVar5 = *(char **)(lVar1 + 0x10), pcVar5 != (char *)0x0 &&
                (iVar2 = strcmp(name,pcVar5), iVar2 == 0)))) {
              *(undefined8 *)(lVar10 + uVar9 * 8) =
                   *(undefined8 *)
                    (*(long *)((long)pvVar3 + 0x10) + *(long *)((long)pvVar3 + 0x20) * 8);
              break;
            }
          }
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
        *(undefined8 *)((long)pvVar3 + 0x28) = 0;
        pVar7 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar7;
}

Assistant:

static enum parser_error visuals_parse_cycle(struct parser *parser)
{
	struct visuals_parse_context *context = parser_priv(parser);
	const char *parsed_group = NULL;
	const char *parsed_name = NULL;
	size_t i = 0;
	size_t current_group_index = 0;

	if (context == NULL) {
		return PARSE_ERROR_INTERNAL;
	}

	/* Move to the next available slot in the cycle list. This will start the
	 * list at 1 (instead of zero), but we need to use cycles_index to keep
	 * track of which cycle we will be adding colors to. */
	context->cycles_index++;

	if (context->cycles_index >= context->max_cycles) {
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}

	parsed_group = parser_getsym(parser, "group");

	if (parsed_group == NULL || strlen(parsed_group) == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	parsed_name = parser_getsym(parser, "name");

	if (parsed_name == NULL || strlen(parsed_name) == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	/* Create a new cycle with the maximum number of steps (if we can),
	 * otherwise bail. */
	if (context->cycles[context->cycles_index] == NULL) {
		context->cycles[context->cycles_index] = visuals_color_cycle_new(parsed_name,
																		 VISUALS_STEPS_MAX,
																		 VISUALS_INVALID_COLOR);

		if (context->cycles[context->cycles_index] == NULL) {
			return PARSE_ERROR_INTERNAL;
		}
	}

	/* Find the group that matches the parsed cycle's group or create a new one
	 * if not found. */
	current_group_index = context->max_groups;

	for (i = 0; i < context->max_groups; i++) {
		if (context->group_names[i] == NULL) {
			context->group_names[i] = string_make(parsed_group);
			current_group_index = i;
			break;
		}
		else {
			const char *existing_group = context->group_names[i];

			if (existing_group != NULL && streq(parsed_group, existing_group)) {
				current_group_index = i;
				break;
			}
		}
	}

	/* Assign the parsed cycle to its group. If a cycle with a matching name is
	 * found, the parsed cycle replaces that one, otherwise, it is added to the
	 * end of the group. */
	for (i = 0; i < VISUALS_CYCLES_MAX; i++) {
		size_t offset = current_group_index * VISUALS_CYCLES_MAX + i;

		if (offset >= context->max_group_cycles) {
			continue;
		}

		if (context->group_cycles[offset] == NULL) {
			context->group_cycles[offset] = context->cycles[context->cycles_index];
			break;
		}
		else {
			const char *existing_name = context->group_cycles[offset]->cycle_name;

			if (existing_name != NULL && streq(parsed_name, existing_name)) {
				context->group_cycles[offset] = context->cycles[context->cycles_index];
				break;
			}
		}
	}

	/* Reset the step index before we start adding colors to the cycle. */
	context->cycle_step_index = 0;

	return PARSE_ERROR_NONE;
}